

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<short>::produceLA32Output
          (RendererImpl<short> *this,IntSample *buffer,Bit32u len)

{
  ushort uVar1;
  DACInputMode DVar2;
  long lVar3;
  IntSample IVar4;
  int iVar5;
  
  DVar2 = ((this->super_Renderer).synth)->dacInputMode;
  if (DVar2 == DACInputMode_GENERATION2) {
    for (lVar3 = 0; len != (Bit32u)lVar3; lVar3 = lVar3 + 1) {
      uVar1 = buffer[lVar3];
      buffer[lVar3] =
           (ushort)((uint)(int)(short)uVar1 >> 0xe) & 1 | (uVar1 & 0x8000) + (uVar1 & 0x3fff) * 2;
    }
  }
  else if (DVar2 == DACInputMode_NICE) {
    for (lVar3 = 0; len != (Bit32u)lVar3; lVar3 = lVar3 + 1) {
      iVar5 = buffer[lVar3] * 2;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      IVar4 = (IntSample)iVar5;
      if (0x7ffe < iVar5) {
        IVar4 = 0x7fff;
      }
      buffer[lVar3] = IVar4;
    }
  }
  return;
}

Assistant:

void RendererImpl<IntSample>::produceLA32Output(IntSample *buffer, Bit32u len) {
	switch (synth.getDACInputMode()) {
		case DACInputMode_GENERATION2:
			while (len--) {
				*buffer = (*buffer & 0x8000) | ((*buffer << 1) & 0x7FFE) | ((*buffer >> 14) & 0x0001);
				++buffer;
			}
			break;
		case DACInputMode_NICE:
			while (len--) {
				*buffer = Synth::clipSampleEx(IntSampleEx(*buffer) << 1);
				++buffer;
			}
			break;
		default:
			break;
	}
}